

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O2

vec_t ImGuizmo::Normalized(vec_t *v)

{
  vec_t vVar1;
  vec_t res;
  vec_t local_18;
  
  local_18.x = v->x;
  local_18.y = v->y;
  local_18.z = v->z;
  local_18.w = v->w;
  vec_t::Normalize(&local_18);
  vVar1.z = local_18.z;
  vVar1.w = local_18.w;
  vVar1.x = local_18.x;
  vVar1.y = local_18.y;
  return vVar1;
}

Assistant:

vec_t Normalized(const vec_t& v) { vec_t res; res = v; res.Normalize(); return res; }